

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

void __thiscall
pbrt::Image::Image(Image *this,
                  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *p16c,
                  Point2i resolution,
                  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  channels)

{
  size_t sVar1;
  memory_resource *pmVar2;
  int vb;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_48;
  Tuple2<pbrt::Point2,_int> local_40;
  size_t va;
  
  this->format = Half;
  (this->resolution).super_Tuple2<pbrt::Point2,_int> = resolution.super_Tuple2<pbrt::Point2,_int>;
  local_40 = resolution.super_Tuple2<pbrt::Point2,_int>;
  va = (size_t)pstd::pmr::new_delete_resource();
  local_48 = &this->channelNames;
  pstd::vector<std::__cxx11::string,pstd::pmr::polymorphic_allocator<std::__cxx11::string>>::
  vector<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,pstd::pmr::polymorphic_allocator<std::__cxx11::string>> *)
             &this->channelNames,channels.ptr,channels.ptr + channels.n,
             (polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&va);
  (this->encoding).
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = 0;
  pmVar2 = pstd::pmr::new_delete_resource();
  (this->p8).alloc.memoryResource = pmVar2;
  (this->p8).ptr = (uchar *)0x0;
  (this->p8).nAlloc = 0;
  (this->p8).nStored = 0;
  (this->p16).alloc.memoryResource = (p16c->alloc).memoryResource;
  (this->p16).nStored = 0;
  (this->p16).ptr = (Half *)0x0;
  (this->p16).nAlloc = 0;
  sVar1 = p16c->nStored;
  (this->p16).nAlloc = p16c->nAlloc;
  (this->p16).nStored = sVar1;
  (this->p16).ptr = p16c->ptr;
  p16c->nStored = 0;
  p16c->ptr = (Half *)0x0;
  p16c->nAlloc = 0;
  pmVar2 = pstd::pmr::new_delete_resource();
  (this->p32).alloc.memoryResource = pmVar2;
  (this->p32).ptr = (float *)0x0;
  (this->p32).nAlloc = 0;
  (this->p32).nStored = 0;
  va = (this->p16).nStored;
  vb = resolution.super_Tuple2<pbrt::Point2,_int>.y * local_40.x * (int)(this->channelNames).nStored
  ;
  if (va != (long)vb) {
    LogFatal<char_const(&)[11],char_const(&)[44],char_const(&)[11],unsigned_long&,char_const(&)[44],int&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp"
               ,0x1b9,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [11])"p16.size()",
               (char (*) [44])"NChannels() * resolution[0] * resolution[1]",
               (char (*) [11])"p16.size()",(unsigned_long *)&va,
               (char (*) [44])"NChannels() * resolution[0] * resolution[1]",&vb);
  }
  if (this->format == Half) {
    return;
  }
  LogFatal<char_const(&)[16]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp"
             ,0x1ba,"Check failed: %s",(char (*) [16])"Is16Bit(format)");
}

Assistant:

Image::Image(pstd::vector<Half> p16c, Point2i resolution,
             pstd::span<const std::string> channels)
    : format(PixelFormat::Half),
      resolution(resolution),
      channelNames(channels.begin(), channels.end()),
      p16(std::move(p16c)) {
    CHECK_EQ(p16.size(), NChannels() * resolution[0] * resolution[1]);
    CHECK(Is16Bit(format));
}